

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

DesugaredObject * jsonnet::internal::makeStdlibAST(Allocator *alloc,string *filename)

{
  pointer pcVar1;
  DesugaredObject *pDVar2;
  Desugarer desugarer;
  string local_48;
  Desugarer local_28;
  
  local_28.isStdlib = true;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_28.alloc = alloc;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + filename->_M_string_length);
  pDVar2 = Desugarer::stdlibAST(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pDVar2;
}

Assistant:

DesugaredObject *makeStdlibAST(Allocator *alloc, std::string filename) {
    Desugarer desugarer(alloc, true);
    return desugarer.stdlibAST(filename);
}